

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

ETraceStatus ProcessRailHit(FTraceResults *res,void *userdata)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  AActor *pAVar12;
  ulong uVar13;
  DVector2 ofs;
  double local_88;
  double local_80;
  double local_78;
  int local_50;
  int local_4c;
  double local_48;
  double dStack_40;
  int local_38;
  undefined4 uStack_34;
  double local_30;
  
  if (res->HitType != TRACE_HitActor) {
    if (res->HitType == TRACE_CrossingPortal) {
      dVar2 = (res->HitPos).Z;
      local_48 = (res->HitPos).X;
      dStack_40 = (res->HitPos).Y;
      dVar3 = (res->SrcFromTarget).Z;
      dVar4 = (res->SrcFromTarget).Y;
      dVar5 = (res->SrcFromTarget).X;
      dVar6 = (res->HitVector).Z;
      dVar7 = (res->HitVector).Y;
      dVar8 = (res->HitVector).X;
      TArray<SPortalHit,_SPortalHit>::Grow
                ((TArray<SPortalHit,_SPortalHit> *)((long)userdata + 0x18),1);
      lVar11 = *(long *)((long)userdata + 0x18);
      uVar9 = *(uint *)((long)userdata + 0x24);
      uVar13 = (ulong)uVar9;
      pdVar1 = (double *)(lVar11 + uVar13 * 0x48);
      *pdVar1 = local_48;
      pdVar1[1] = dStack_40;
      *(double *)(lVar11 + 0x10 + uVar13 * 0x48) = dVar2;
      *(double *)(lVar11 + 0x18 + uVar13 * 0x48) = dVar5;
      *(double *)(lVar11 + 0x20 + uVar13 * 0x48) = dVar4;
      *(double *)(lVar11 + 0x28 + uVar13 * 0x48) = dVar3;
      *(double *)(lVar11 + 0x30 + uVar13 * 0x48) = dVar8;
      *(double *)(lVar11 + 0x38 + uVar13 * 0x48) = dVar7;
      *(double *)(lVar11 + 0x40 + uVar13 * 0x48) = dVar6;
      *(uint *)((long)userdata + 0x24) = uVar9 + 1;
      return TRACE_Continue;
    }
    return TRACE_Stop;
  }
  if ((*(char *)((long)userdata + 0x2d) == '\x01') &&
     (((res->Actor->flags2).Value & 0x8000000) != 0)) {
    return TRACE_Stop;
  }
  if (*(char *)((long)userdata + 0x31) == '\0') {
    if (*(char *)((long)userdata + 0x30) == '\x01') {
      (*(res->Actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_38);
      (**(code **)(**userdata + 0x108))(&local_4c);
      if (local_38 == local_4c) {
        return TRACE_Skip;
      }
    }
    if ((*(char *)((long)userdata + 0x2f) != '\x01') ||
       ((*(res->Actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_50),
       local_50 != *(int *)((long)userdata + 0x28))) {
      if ((*(char *)((long)userdata + 0x2e) == '\x01') && (((res->Actor->flags3).Value & 8) != 0)) {
        return TRACE_Skip;
      }
      pAVar12 = res->Actor;
      local_88 = (res->HitPos).Z;
      local_80 = (res->HitPos).X;
      local_78 = (res->HitPos).Y;
      dVar2 = (res->SrcAngleFromTarget).Degrees;
      if ((i_compatflags._3_1_ & 0x10) != 0) {
        P_GetOffsetPosition(local_80,local_78,(res->HitVector).X * -10.0,(res->HitVector).Y * -10.0)
        ;
        local_80 = (double)CONCAT44(uStack_34,local_38);
        local_78 = local_30;
        local_88 = local_88 + (res->HitVector).Z * 10.0;
      }
      TArray<SRailHit,_SRailHit>::Grow((TArray<SRailHit,_SRailHit> *)((long)userdata + 8),1);
      lVar11 = *(long *)((long)userdata + 8);
      uVar9 = *(uint *)((long)userdata + 0x14);
      uVar13 = (ulong)uVar9;
      *(AActor **)(lVar11 + uVar13 * 0x28) = pAVar12;
      *(double *)(lVar11 + 8 + uVar13 * 0x28) = local_80;
      *(double *)(lVar11 + 0x10 + uVar13 * 0x28) = local_78;
      *(double *)(lVar11 + 0x18 + uVar13 * 0x28) = local_88;
      *(double *)(lVar11 + 0x20 + uVar13 * 0x28) = dVar2;
      *(uint *)((long)userdata + 0x14) = uVar9 + 1;
      iVar10 = *(int *)((long)userdata + 0x34);
      if (iVar10 != 0) {
        *(int *)((long)userdata + 0x38) = *(int *)((long)userdata + 0x38) + 1;
      }
      if (*(byte *)((long)userdata + 0x2c) == 0 && iVar10 != 0) {
        return (uint)(*(int *)((long)userdata + 0x38) < iVar10);
      }
      return *(byte *)((long)userdata + 0x2c) ^ TRACE_Continue;
    }
  }
  return TRACE_Skip;
}

Assistant:

static ETraceStatus ProcessRailHit(FTraceResults &res, void *userdata)
{
	RailData *data = (RailData *)userdata;
	if (res.HitType == TRACE_CrossingPortal)
	{
		SPortalHit newhit;
		newhit.HitPos = res.HitPos;
		newhit.ContPos = res.SrcFromTarget;
		newhit.OutDir = res.HitVector;
		data->PortalHits.Push(newhit);
		return TRACE_Continue;
	}

	if (res.HitType != TRACE_HitActor)
	{
		return TRACE_Stop;
	}

	// Invulnerable things completely block the shot
	if (data->StopAtInvul && res.Actor->flags2 & MF2_INVULNERABLE)
	{
		return TRACE_Stop;
	}

	// Skip actors if the puff has:
	// 1. THRUACTORS (This one did NOT include a check for spectral)
	// 2. MTHRUSPECIES on puff and the shooter has same species as the hit actor
	// 3. THRUSPECIES on puff and the puff has same species as the hit actor
	// 4. THRUGHOST on puff and the GHOST flag on the hit actor

	if ((data->ThruActors) ||
		(data->MThruSpecies && res.Actor->GetSpecies() == data->Caller->GetSpecies()) ||
		(data->ThruSpecies && res.Actor->GetSpecies() == data->PuffSpecies) ||
		(data->ThruGhosts && res.Actor->flags3 & MF3_GHOST))
	{
		return TRACE_Skip;
	}

	// Save this thing for damaging later, and continue the trace
	SRailHit newhit;
	newhit.HitActor = res.Actor;
	newhit.HitPos = res.HitPos;
	newhit.HitAngle = res.SrcAngleFromTarget;
	if (i_compatflags & COMPATF_HITSCAN)
	{
		DVector2 ofs = P_GetOffsetPosition(newhit.HitPos.X, newhit.HitPos.Y, -10 * res.HitVector.X, -10 * res.HitVector.Y);
		newhit.HitPos.X = ofs.X;
		newhit.HitPos.Y = ofs.Y;
		newhit.HitPos.Z -= -10 * res.HitVector.Z;
	}
	data->RailHits.Push(newhit);

	if (data->limit)
	{
		data->count++;
	}
	return (data->StopAtOne || (data->limit && (data->count >= data->limit))) ? TRACE_Stop : TRACE_Continue;
}